

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  curl_slist *pcVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  Curl_addrinfo *pCVar8;
  void *pvVar9;
  Curl_dns_entry *pCVar10;
  int *buflen;
  Curl_addrinfo *buflen_00;
  char *pcVar11;
  curl_slist **ppcVar12;
  Curl_easy *pCVar13;
  curl_slist **ppcVar14;
  char *__s;
  Curl_addrinfo *pCVar15;
  int port;
  Curl_easy *local_2a8;
  Curl_addrinfo *local_2a0;
  char *local_298;
  curl_slist **local_290;
  Curl_addrinfo *local_288;
  char *local_280;
  char hostname [256];
  char address [64];
  char entry_id [262];
  
  port = 0;
  puVar1 = &(data->change).field_0x20;
  *puVar1 = *puVar1 & 0xfb;
  ppcVar12 = &(data->change).resolve;
  ppcVar14 = ppcVar12;
  local_2a8 = data;
  do {
    buflen = &port;
    pcVar2 = *ppcVar14;
    if (pcVar2 == (curl_slist *)0x0) {
      *ppcVar12 = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar7 = pcVar2->data;
    if (pcVar7 != (char *)0x0) {
      if (*pcVar7 == '-') {
        iVar3 = __isoc99_sscanf(pcVar7 + 1,"%255[^:]:%d",hostname);
        if (iVar3 == 2) {
          create_hostcache_id(hostname,port,entry_id,(size_t)buflen);
          sVar4 = strlen(entry_id);
          if (local_2a8->share != (Curl_share *)0x0) {
            Curl_share_lock(local_2a8,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          pCVar13 = local_2a8;
          Curl_hash_delete((local_2a8->dns).hostcache,entry_id,sVar4 + 1);
          if (pCVar13->share != (Curl_share *)0x0) {
            Curl_share_unlock(local_2a8,CURL_LOCK_DATA_DNS);
          }
        }
        else {
          Curl_infof(local_2a8,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n",
                     pcVar2->data);
        }
      }
      else {
        pcVar5 = strchr(pcVar7,0x3a);
        if ((pcVar5 == (char *)0x0) || (0xff < (long)pcVar5 - (long)pcVar7)) {
LAB_00121adb:
          pCVar13 = local_2a8;
          pCVar15 = (Curl_addrinfo *)0x0;
          pcVar7 = local_298;
        }
        else {
          memcpy(hostname,pcVar7,(long)pcVar5 - (long)pcVar7);
          buflen_00 = (Curl_addrinfo *)(pcVar5 + -(long)pcVar2->data);
          hostname[(long)buflen_00] = '\0';
          uVar6 = strtoul(pcVar5 + 1,&local_298,10);
          if ((0xffff < uVar6) || ((local_298 == pcVar5 + 1 || (*local_298 != ':'))))
          goto LAB_00121adb;
          port = (int)uVar6;
          local_280 = local_298 + 1;
          pcVar5 = local_298;
          pCVar15 = (Curl_addrinfo *)0x0;
          local_290 = ppcVar12;
          pCVar8 = (Curl_addrinfo *)0x0;
          while (local_288 = pCVar8, local_2a0 = pCVar15, ppcVar12 = local_290, *pcVar5 != '\0') {
            __s = pcVar5 + 1;
            pcVar7 = strchr(__s,0x2c);
            if (pcVar7 == (char *)0x0) {
              sVar4 = strlen(__s);
              pcVar7 = __s + sVar4;
            }
            pcVar11 = pcVar7;
            pCVar13 = local_2a8;
            ppcVar12 = local_290;
            pCVar15 = local_2a0;
            if (*__s == '[') {
              if ((pcVar7 == __s) || (pcVar7[-1] != ']')) goto LAB_00121ae8;
              __s = pcVar5 + 2;
              pcVar11 = pcVar7 + -1;
            }
            uVar6 = (long)pcVar11 - (long)__s;
            pcVar5 = pcVar7;
            pCVar8 = local_288;
            if (uVar6 != 0) {
              if (0x3f < uVar6) goto LAB_00121ae8;
              memcpy(address,__s,uVar6);
              address[uVar6] = '\0';
              pCVar8 = Curl_str2addr(address,port);
              pCVar13 = local_2a8;
              if (pCVar8 == (Curl_addrinfo *)0x0) {
                local_298 = pcVar7;
                Curl_infof(local_2a8,"Resolve address \'%s\' found illegal!\n",address);
                ppcVar12 = local_290;
                pCVar15 = local_2a0;
                pcVar7 = local_298;
                goto LAB_00121ae8;
              }
              buflen_00 = local_288;
              pCVar15 = pCVar8;
              if (local_288 != (Curl_addrinfo *)0x0) {
                local_288->ai_next = pCVar8;
                pCVar15 = local_2a0;
              }
            }
          }
          if (local_2a0 != (Curl_addrinfo *)0x0) {
            local_298 = pcVar5;
            create_hostcache_id(hostname,port,entry_id,(size_t)buflen_00);
            sVar4 = strlen(entry_id);
            if (local_2a8->share != (Curl_share *)0x0) {
              Curl_share_lock(local_2a8,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
            }
            pvVar9 = Curl_hash_pick((local_2a8->dns).hostcache,entry_id,sVar4 + 1);
            pCVar13 = local_2a8;
            if (pvVar9 != (void *)0x0) {
              Curl_infof(local_2a8,"RESOLVE %s:%d is - old addresses discarded!\n",hostname,
                         (ulong)(uint)port);
              Curl_hash_delete((pCVar13->dns).hostcache,entry_id,sVar4 + 1);
            }
            pCVar10 = Curl_cache_addr(local_2a8,local_2a0,hostname,port);
            if (pCVar10 != (Curl_dns_entry *)0x0) {
              pCVar10->timestamp = 0;
              pCVar10->inuse = pCVar10->inuse + -1;
            }
            if (local_2a8->share != (Curl_share *)0x0) {
              Curl_share_unlock(local_2a8,CURL_LOCK_DATA_DNS);
            }
            if (pCVar10 == (Curl_dns_entry *)0x0) {
              Curl_freeaddrinfo(local_2a0);
              return CURLE_OUT_OF_MEMORY;
            }
            Curl_infof(local_2a8,"Added %s:%d:%s to DNS cache\n",hostname,(ulong)(uint)port,
                       local_280);
            pCVar13 = local_2a8;
            if ((hostname[0] == '*') && (hostname[1] == '\0')) {
              Curl_infof(local_2a8,"RESOLVE %s:%d is wildcard, enabling wildcard checks\n",hostname,
                         (ulong)(uint)port);
              puVar1 = &(pCVar13->change).field_0x20;
              *puVar1 = *puVar1 | 4;
            }
            goto LAB_00121b1e;
          }
          pCVar13 = local_2a8;
          pCVar15 = (Curl_addrinfo *)0x0;
          pcVar7 = pcVar5;
        }
LAB_00121ae8:
        local_298 = pcVar7;
        Curl_infof(pCVar13,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n",pcVar2->data);
        Curl_freeaddrinfo(pCVar15);
      }
    }
LAB_00121b1e:
    ppcVar14 = &pcVar2->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  /* Default is no wildcard found */
  data->change.wildcard_resolve = false;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_end = strchr(hostp->data, ':');
      if(!host_end ||
         ((host_end - hostp->data) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, hostp->data, host_end - hostp->data);
      hostname[host_end - hostp->data] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.\n",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal!\n", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        Curl_freeaddrinfo(head);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %s:%d is - old addresses discarded!\n",
                hostname, port);
        /* delete old entry entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as added by CURLOPT_RESOLVE. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, hostname, port);
      if(dns) {
        dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
            dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, addresses);

      /* Wildcard hostname */
      if(hostname[0] == '*' && hostname[1] == '\0') {
        infof(data, "RESOLVE %s:%d is wildcard, enabling wildcard checks\n",
              hostname, port);
        data->change.wildcard_resolve = true;
      }
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}